

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

void __thiscall pstore::file::file_handle::unlock(file_handle *this,uint64_t offset,size_t size)

{
  int iVar1;
  int *piVar2;
  undefined1 local_48 [44];
  int err;
  size_t size_local;
  uint64_t offset_local;
  file_handle *this_local;
  
  unique0x100000f2 = size;
  size_local = offset;
  offset_local = (uint64_t)this;
  if ((offset < 0x8000000000000000) && (size < 0x8000000000000000)) {
    ensure_open(this);
    iVar1 = lock_reg(this->file_,6,2,size_local,0,stack0xffffffffffffffe0);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      local_48._36_4_ = iVar1;
      path_abi_cxx11_((file_handle *)local_48);
      (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
                (iVar1,"fcntl/unlock failed",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    }
    return;
  }
  raise<std::errc,char[5]>(invalid_argument,(char (*) [5])0x14e056);
}

Assistant:

void file_handle::unlock (std::uint64_t const offset, std::size_t const size) {
            if (offset > uoff_max || size > uoff_max) {
                raise (std::errc::invalid_argument, "lock");
            }
            this->ensure_open ();
            if (file_handle::lock_reg (file_, F_SETLK,
                                       F_UNLCK, // release an existing lock
                                       static_cast<off_t> (offset), SEEK_SET,
                                       static_cast<off_t> (size)) != 0) {
                int const err = errno;
                raise_file_error (err, "fcntl/unlock failed", this->path ());
            }
        }